

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cst_controller.cpp
# Opt level: O0

void __thiscall r_exec::CSTController::CSTController(CSTController *this,View *view)

{
  Code *pCVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  CSTOverlay *this_00;
  HLPBindingMap *bindings;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  HLPController *o_00;
  ulong uVar5;
  undefined8 extraout_RDX;
  P<r_exec::HLPController> local_80;
  long local_78;
  View *pattern_hlp_v;
  Code *pattern_hlp;
  long *plStack_60;
  uint16_t opcode;
  Code *pattern_ihlp;
  Code *pattern;
  uint16_t i;
  uint16_t obj_count;
  Code *pCStack_48;
  uint16_t obj_set_index;
  Code *object;
  Group *host;
  CSTOverlay *local_20;
  CSTOverlay *o;
  View *view_local;
  CSTController *this_local;
  
  o = (CSTOverlay *)view;
  view_local = (View *)this;
  HLPController::HLPController(&this->super_HLPController,view);
  (this->super_HLPController).super_OController.super_Controller.super__Object._vptr__Object =
       (_func_int **)&PTR__CSTController_002ea4f0;
  std::mutex::mutex(&this->m_mutex);
  this_00 = (CSTOverlay *)operator_new(0x148);
  bindings = core::P::operator_cast_to_HLPBindingMap_((P *)&(this->super_HLPController).bindings);
  CSTOverlay::CSTOverlay(this_00,(Controller *)this,bindings);
  local_20 = this_00;
  CSTOverlay::load_patterns(this_00);
  core::P<r_exec::Overlay>::P((P<r_exec::Overlay> *)&host,(Overlay *)local_20);
  r_code::list<core::P<r_exec::Overlay>_>::push_back
            (&(this->super_HLPController).super_OController.overlays,(P<r_exec::Overlay> *)&host);
  core::P<r_exec::Overlay>::~P((P<r_exec::Overlay> *)&host);
  object = (Code *)HLPController::get_host(&this->super_HLPController);
  pCStack_48 = HLPController::get_unpacked_object(&this->super_HLPController);
  (*(pCStack_48->super__Object)._vptr__Object[4])(pCStack_48,2);
  pattern._6_2_ = r_code::Atom::asIndex();
  (*(pCStack_48->super__Object)._vptr__Object[4])(pCStack_48,(ulong)pattern._6_2_);
  bVar2 = r_code::Atom::getAtomCount();
  pattern._4_2_ = (ushort)bVar2;
  for (pattern._2_2_ = 0; pCVar1 = pCStack_48, pattern._2_2_ < pattern._4_2_;
      pattern._2_2_ = pattern._2_2_ + 1) {
    uVar5 = (ulong)(pattern._6_2_ + 1);
    (*(pCStack_48->super__Object)._vptr__Object[4])(pCStack_48,(ulong)(ushort)(pattern._6_2_ + 1));
    uVar3 = r_code::Atom::asIndex();
    iVar4 = (*(pCVar1->super__Object)._vptr__Object[9])
                      (pCVar1,(ulong)uVar3,extraout_RDX,CONCAT62((int6)(uVar5 >> 0x10),uVar3));
    pattern_ihlp = (Code *)CONCAT44(extraout_var,iVar4);
    iVar4 = (*(pattern_ihlp->super__Object)._vptr__Object[9])(pattern_ihlp,0);
    plStack_60 = (long *)CONCAT44(extraout_var_00,iVar4);
    (**(code **)(*plStack_60 + 0x20))(plStack_60,0);
    pattern_hlp._6_2_ = r_code::Atom::asOpcode();
    if ((pattern_hlp._6_2_ == Opcodes::ICst) || (pattern_hlp._6_2_ == Opcodes::IMdl)) {
      pattern_hlp_v = (View *)(**(code **)(*plStack_60 + 0x48))(plStack_60,0);
      iVar4 = (*(pattern_hlp_v->super_View).super__Object._vptr__Object[0x18])
                        (pattern_hlp_v,object,1);
      local_78 = CONCAT44(extraout_var_01,iVar4);
      if (local_78 != 0) {
        o_00 = core::P::operator_cast_to_HLPController_((P *)(local_78 + 0xb0));
        core::P<r_exec::HLPController>::P(&local_80,o_00);
        std::
        vector<core::P<r_exec::HLPController>,_std::allocator<core::P<r_exec::HLPController>_>_>::
        push_back(&(this->super_HLPController).controllers,&local_80);
        core::P<r_exec::HLPController>::~P(&local_80);
      }
    }
  }
  return;
}

Assistant:

CSTController::CSTController(r_code::View *view): HLPController(view)
{
    CSTOverlay *o = new CSTOverlay(this, bindings); // master overlay.
    o->load_patterns();
    overlays.push_back(o);
    Group *host = get_host();
    Code *object = get_unpacked_object();
    uint16_t obj_set_index = object->code(CST_OBJS).asIndex();
    uint16_t obj_count = object->code(obj_set_index).getAtomCount();

    for (uint16_t i = 0; i < obj_count; ++i) {
        Code *pattern = object->get_reference(object->code(obj_set_index + 1).asIndex());
        Code *pattern_ihlp = pattern->get_reference(0);
        uint16_t opcode = pattern_ihlp->code(0).asOpcode();

        if (opcode == Opcodes::ICst ||
            opcode == Opcodes::IMdl) {
            Code *pattern_hlp = pattern_ihlp->get_reference(0);
            r_exec::View *pattern_hlp_v = (r_exec::View*)pattern_hlp->get_view(host, true);

            if (pattern_hlp_v) {
                controllers.push_back((HLPController *)pattern_hlp_v->controller);
            }
        }
    }
}